

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O0

void * __thiscall
v_hashmap<unsigned_long,_features>::iterator(v_hashmap<unsigned_long,_features> *this)

{
  hash_elem **pphVar1;
  long in_RDI;
  hash_elem *e;
  hash_elem *local_18;
  
  pphVar1 = v_array<v_hashmap<unsigned_long,_features>::hash_elem>::begin
                      ((v_array<v_hashmap<unsigned_long,_features>::hash_elem> *)(in_RDI + 0x78));
  local_18 = *pphVar1;
  while( true ) {
    if (local_18 == *(hash_elem **)(in_RDI + 0x88)) {
      return (void *)0x0;
    }
    if ((local_18->occupied & 1U) != 0) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

void* iterator()
  {
    hash_elem* e = dat.begin();
    while (e != dat.end_array)
    {
      if (e->occupied)
        return e;
      e++;
    }
    return nullptr;
  }